

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

unique_ptr<Catch::Generators::SingleValueGenerator<unary_op_tuple<trng::optimized_impl::uint128,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<Catch::Generators::SingleValueGenerator<unary_op_tuple<trng::optimized_impl::uint128,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
 __thiscall
Catch::Generators::pf::
make_unique<Catch::Generators::SingleValueGenerator<unary_op_tuple<trng::optimized_impl::uint128,std::__cxx11::string>>,unary_op_tuple<trng::optimized_impl::uint128,std::__cxx11::string>>
          (pf *this,
          unary_op_tuple<trng::optimized_impl::uint128,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *args)

{
  SingleValueGenerator<unary_op_tuple<trng::optimized_impl::uint128,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  
  this_00 = (SingleValueGenerator<unary_op_tuple<trng::optimized_impl::uint128,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)operator_new(0x40);
  SingleValueGenerator<unary_op_tuple<trng::optimized_impl::uint128,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::SingleValueGenerator(this_00,args);
  *(SingleValueGenerator<unary_op_tuple<trng::optimized_impl::uint128,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    **)this = this_00;
  return (__uniq_ptr_data<Catch::Generators::SingleValueGenerator<unary_op_tuple<trng::optimized_impl::uint128,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<Catch::Generators::SingleValueGenerator<unary_op_tuple<trng::optimized_impl::uint128,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_true>
          )(__uniq_ptr_data<Catch::Generators::SingleValueGenerator<unary_op_tuple<trng::optimized_impl::uint128,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<Catch::Generators::SingleValueGenerator<unary_op_tuple<trng::optimized_impl::uint128,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> make_unique( Args&&... args ) {
            return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
        }